

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

void __thiscall
EDCircles::DetectArcs(EDCircles *this,vector<LineSegment,_std::allocator<LineSegment>_> *lines)

{
  Info *pIVar1;
  pointer pLVar2;
  BufferManager *pBVar3;
  pointer pvVar4;
  Circle *pCVar5;
  double circleFitError_00;
  double r_00;
  bool bVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  double *y;
  ulong uVar12;
  long lVar13;
  double *x;
  uint uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  bool *pbVar18;
  uint uVar19;
  int *piVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double *pdVar31;
  undefined8 in_XMM3_Qb;
  double *in_XMM6_Qa;
  int local_150;
  double eTheta;
  int local_134;
  double *local_130;
  ulong local_128;
  ulong local_120;
  double Error;
  double eTheta_1;
  double *local_108;
  undefined8 uStack_100;
  double local_f0;
  double yc;
  double xc;
  long local_d8;
  double yc_1;
  double xc_1;
  int local_bc;
  undefined1 local_b8 [16];
  ulong local_a0;
  double circleFitError;
  double radius;
  double sTheta;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  int *local_50;
  long local_48;
  double error;
  double r;
  
  iVar7 = (this->super_EDPF).super_ED.width;
  iVar11 = (this->super_EDPF).super_ED.height;
  if (iVar11 < iVar7) {
    iVar11 = iVar7;
  }
  local_a0 = (ulong)(uint)(iVar11 / 5);
  local_50 = &this->noCircles1;
  local_134 = 1;
  auVar30 = ZEXT816(0x3ff0c152382d7365);
  do {
    local_b8 = ZEXT816(0x3ffa749cc47da8bb);
    if (local_134 != 2) {
      local_b8 = auVar30;
    }
    if (0 < (this->super_EDPF).super_ED.segmentNos) {
      lVar8 = 0;
      do {
        uVar22 = this->segmentStartLines[lVar8];
        iVar7 = this->segmentStartLines[lVar8 + 1];
        if (1 < (int)(iVar7 - uVar22)) {
          local_128 = (long)iVar7 - 1;
          if ((int)uVar22 < (int)local_128) {
            local_d8 = (long)(int)local_128;
            local_48 = -local_d8;
            do {
              uVar12 = (ulong)uVar22;
              pIVar1 = this->info;
              if (pIVar1[(int)uVar22].taken == true) {
LAB_0010d06f:
                uVar9 = uVar22 + 1;
              }
              else {
                pLVar2 = (lines->super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                iVar7 = pLVar2[(int)uVar22].len;
                if ((int)local_a0 <= iVar7) goto LAB_0010d06f;
                dVar28 = pIVar1[(int)uVar22].angle;
                uVar9 = uVar22 + 1;
                if ((0.10471975511965977 <= dVar28) && (dVar28 <= (double)local_b8._0_8_)) {
                  uVar17 = (ulong)uVar9;
                  if ((int)uVar9 < (int)(uint)local_128) {
                    lVar15 = (long)(int)uVar9;
                    pbVar18 = &pIVar1[lVar15].taken;
                    piVar20 = &pLVar2[lVar15].len;
                    lVar13 = 0;
                    do {
                      if ((((*pbVar18 != false) ||
                           (((Info *)(pbVar18 + -0x10))->sign != pIVar1[(int)uVar22].sign)) ||
                          ((int)local_a0 <= *piVar20)) ||
                         ((*(double *)(pbVar18 + -8) < 0.10471975511965977 ||
                          ((double)local_b8._0_8_ < *(double *)(pbVar18 + -8))))) {
                        uVar17 = (ulong)(uVar9 - (int)lVar13);
                        goto LAB_0010d08d;
                      }
                      lVar13 = lVar13 + -1;
                      pbVar18 = pbVar18 + 0x18;
                      piVar20 = piVar20 + 0x12;
                    } while (lVar15 + local_48 != lVar13);
                    uVar17 = local_128 & 0xffffffff;
                  }
LAB_0010d08d:
                  uVar16 = (uint)uVar17;
                  uVar25 = 0;
                  if (uVar16 - uVar22 == 1) {
                    if (0.2617993877991494 <= dVar28) {
                      iVar11 = pLVar2[(int)uVar9].len;
                      iVar24 = iVar7;
                      if (iVar11 < iVar7) {
                        iVar24 = iVar11;
                      }
                      iVar23 = iVar7;
                      if (iVar7 < iVar11) {
                        iVar23 = iVar11;
                      }
                      bVar26 = (iVar11 + iVar7 < 0x28 || 0.7853981633974483 < dVar28) ||
                               iVar24 * 2 < iVar23;
                      uVar21 = (ulong)CONCAT31((int3)((uint)(iVar11 + iVar7) >> 8),bVar26) ^ 1;
                    }
                    else {
                      bVar26 = true;
                      uVar21 = 0;
                    }
                    uVar19 = (uint)uVar21;
                    uVar14 = 0xffffffff;
                    if (bVar26) {
                      if (((uVar22 != this->segmentStartLines[lVar8]) ||
                          (pIVar1[local_128].angle < 0.10471975511965977)) ||
                         ((double)local_b8._0_8_ < pIVar1[local_128].angle)) {
                        if (uVar16 == (uint)local_128) {
                          uVar22 = -(uint)(pIVar1[(int)uVar16].angle < 0.10471975511965977 ||
                                          (double)local_b8._0_8_ < pIVar1[(int)uVar16].angle);
                          uVar14 = uVar22 | 2;
                          uVar19 = uVar19 & 0xff;
                          if ((uVar22 & 1) == 0) {
                            uVar19 = 1;
                          }
                        }
                      }
                      else {
                        uVar19 = (uint)CONCAT71((int7)(uVar21 >> 8),1);
                        uVar14 = 1;
                      }
                    }
                    bVar26 = (char)uVar19 == '\0';
                    if (bVar26) {
                      uVar12 = uVar17;
                    }
                    uVar9 = (uint)uVar12;
                    if (bVar26) goto LAB_0010d075;
                  }
                  else {
                    uVar14 = 0xffffffff;
                    uVar19 = 0;
                  }
                  iVar11 = (int)uVar12;
                  pBVar3 = this->bm;
                  local_108 = pBVar3->x;
                  local_130 = pBVar3->y;
                  iVar7 = pBVar3->index;
                  x = local_108 + iVar7;
                  y = local_130 + iVar7;
                  if ((uVar14 == 1) && (iVar24 = pLVar2[local_d8].len, 0 < (long)iVar24)) {
                    lVar13 = *(long *)&(this->super_EDPF).super_ED.segmentPoints.
                                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                       ._M_impl.super__Vector_impl_data +
                             (long)pLVar2[local_d8].firstPixelIndex * 8;
                    uVar25 = 0;
                    do {
                      x[uVar25] = (double)*(int *)(lVar13 + uVar25 * 8);
                      y[uVar25] = (double)*(int *)(lVar13 + 4 + uVar25 * 8);
                      uVar25 = uVar25 + 1;
                    } while ((long)iVar24 != uVar25);
                  }
                  iVar24 = (int)uVar25;
                  local_f0 = (double)CONCAT44(local_f0._4_4_,uVar19);
                  local_bc = uVar16 - iVar11;
                  if (iVar11 <= (int)uVar16) {
                    pvVar4 = (this->super_EDPF).super_ED.segmentPoints.
                             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    lVar13 = (long)iVar11;
                    do {
                      iVar24 = pLVar2[lVar13].len;
                      if (0 < (long)iVar24) {
                        iVar23 = (int)uVar25;
                        lVar15 = *(long *)&pvVar4[lVar8].
                                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                           ._M_impl.super__Vector_impl_data +
                                 (long)pLVar2[lVar13].firstPixelIndex * 8;
                        lVar10 = 0;
                        do {
                          local_108[(long)iVar7 + iVar23 + lVar10] =
                               (double)*(int *)(lVar15 + lVar10 * 8);
                          local_130[(long)iVar7 + iVar23 + lVar10] =
                               (double)*(int *)(lVar15 + 4 + lVar10 * 8);
                          lVar10 = lVar10 + 1;
                        } while (iVar24 != lVar10);
                        uVar25 = (ulong)(uint)(iVar23 + (int)lVar10);
                      }
                      iVar24 = (int)uVar25;
                      lVar13 = lVar13 + 1;
                    } while (uVar16 + 1 != (int)lVar13);
                  }
                  if (uVar14 == 2) {
                    iVar23 = pLVar2[this->segmentStartLines[lVar8]].len;
                    if (0 < (long)iVar23) {
                      lVar13 = *(long *)&(this->super_EDPF).super_ED.segmentPoints.
                                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                         ._M_impl.super__Vector_impl_data +
                               (long)pLVar2[this->segmentStartLines[lVar8]].firstPixelIndex * 8;
                      lVar15 = 0;
                      do {
                        local_108[(long)iVar7 + iVar24 + lVar15] =
                             (double)*(int *)(lVar13 + lVar15 * 8);
                        local_130[(long)iVar7 + iVar24 + lVar15] =
                             (double)*(int *)(lVar13 + 4 + lVar15 * 8);
                        lVar15 = lVar15 + 1;
                      } while (iVar23 != lVar15);
                      iVar24 = iVar24 + (int)lVar15;
                    }
                  }
                  pBVar3->index = iVar7 + iVar24;
                  local_120 = uVar17;
                  CircleFit(x,y,iVar24,&xc,&yc,&radius,&circleFitError);
                  r_00 = radius;
                  circleFitError_00 = circleFitError;
                  dVar29 = xc;
                  dVar28 = yc;
                  pdVar31 = (double *)((double)iVar24 / (radius * 6.283185307179586));
                  uVar9 = uVar16;
                  if ((local_f0._0_1_ == '\0') || (0.0625 <= (double)pdVar31)) {
                    iVar7 = (int)lVar8;
                    if (circleFitError <= *(double *)(&DAT_0011d5c0 + (ulong)(2 < local_bc) * 8)) {
                      if (uVar14 == 1) {
                        iVar23 = (lines->
                                 super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                                 _M_impl.super__Vector_impl_data._M_start[local_d8].len;
                        x = x + iVar23;
                        y = y + iVar23;
                        iVar24 = iVar24 - iVar23;
                      }
                      else if (uVar14 == 2) {
                        iVar24 = iVar24 - (lines->
                                          super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                          )._M_impl.super__Vector_impl_data._M_start
                                          [this->segmentStartLines[lVar8]].len;
                      }
                      if (((double)pdVar31 < 0.67) || (1.5 < circleFitError)) {
                        ComputeStartAndEndAngles(xc,yc,radius,x,y,iVar24,&sTheta,&eTheta);
                        in_XMM3_Qb = 0;
                        addArc(this->edarcs1->arcs,&this->edarcs1->noArcs,dVar29,dVar28,r_00,
                               circleFitError_00,sTheta,eTheta,this->info[iVar11].sign,iVar7,(int)*x
                               ,(int)*y,(int)x[(long)iVar24 + -1],(int)y[(long)iVar24 + -1],x,y,
                               iVar24,(double)in_XMM6_Qa);
                      }
                      else {
                        pCVar5 = this->circles1;
                        in_XMM3_Qb = 0;
                        iVar7 = this->noCircles1;
                        pCVar5[iVar7].xc = xc;
                        pCVar5[iVar7].yc = yc;
                        pCVar5[iVar7].r = radius;
                        pCVar5[iVar7].circleFitError = circleFitError;
                        pCVar5[iVar7].coverRatio = (double)iVar24 / (radius * 6.283185307179586);
                        pCVar5[iVar7].x = x;
                        pCVar5[iVar7].y = y;
                        pCVar5[iVar7].noPixels = iVar24;
                        iVar7 = this->noCircles1;
                        pCVar5[iVar7].isEllipse = false;
                        this->noCircles1 = iVar7 + 1;
                      }
                      if (iVar11 < (int)uVar16) {
                        pbVar18 = &this->info[iVar11].taken;
                        lVar13 = (long)(int)uVar16 - (long)iVar11;
                        do {
                          *pbVar18 = true;
                          pbVar18 = pbVar18 + 0x18;
                          lVar13 = lVar13 + -1;
                        } while (lVar13 != 0);
                      }
                    }
                    else {
                      dVar28 = (*x - x[(long)iVar24 + -1]) * (*x - x[(long)iVar24 + -1]) +
                               (*y - y[(long)iVar24 + -1]) * (*y - y[(long)iVar24 + -1]);
                      if (dVar28 < 0.0) {
                        local_108 = pdVar31;
                        uStack_100 = in_XMM3_Qb;
                        dVar28 = sqrt(dVar28);
                        pdVar31 = local_108;
                        in_XMM3_Qb = uStack_100;
                      }
                      else {
                        dVar28 = SQRT(dVar28);
                      }
                      bVar26 = dVar28 <= r_00 * 1.72;
                      bVar27 = 0.67 <= (double)pdVar31;
                      if ((bVar27 && bVar26) || (local_134 == 1 && 0.25 <= (double)pdVar31)) {
                        local_68 = 0.0;
                        dStack_60 = 0.0;
                        local_78 = 0.0;
                        dStack_70 = 0.0;
                        sTheta = 0.0;
                        dStack_80 = 0.0;
                        local_58 = 0.0;
                        bVar6 = EllipseFit(x,y,iVar24,(EllipseEquation *)&sTheta,1);
                        pdVar31 = (double *)0x4202a05f20000000;
                        if (bVar6) {
                          pdVar31 = (double *)
                                    ComputeEllipseError((EllipseEquation *)&sTheta,x,y,iVar24);
                        }
                        dVar28 = xc;
                        dVar29 = 1.5;
                        if (!bVar27 || !bVar26) {
                          dVar29 = 0.75;
                        }
                        if ((double)pdVar31 <= dVar29) {
                          if (uVar14 == 1) {
                            iVar23 = (lines->
                                     super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                                     _M_impl.super__Vector_impl_data._M_start[local_d8].len;
                            x = x + iVar23;
                            y = y + iVar23;
                            iVar24 = iVar24 - iVar23;
                          }
                          else if (uVar14 == 2) {
                            iVar24 = iVar24 - (lines->
                                              super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                              )._M_impl.super__Vector_impl_data._M_start
                                              [this->segmentStartLines[lVar8]].len;
                          }
                          local_108 = pdVar31;
                          if (bVar27 && bVar26) {
                            in_XMM3_Qb = 0;
                            addCircle(this->circles1,local_50,xc,yc,r_00,circleFitError_00,
                                      (EllipseEquation *)&sTheta,(double)pdVar31,x,y,iVar24);
                          }
                          else {
                            local_130 = (double *)yc;
                            ComputeStartAndEndAngles(xc,yc,r_00,x,y,iVar24,&eTheta,&eTheta_1);
                            in_XMM3_Qb = 0;
                            in_XMM6_Qa = local_108;
                            addArc(this->edarcs1->arcs,&this->edarcs1->noArcs,dVar28,
                                   (double)local_130,r_00,circleFitError_00,eTheta,eTheta_1,
                                   this->info[iVar11].sign,iVar7,(EllipseEquation *)&sTheta,
                                   (double)local_108,(int)*x,(int)*y,(int)x[(long)iVar24 + -1],
                                   (int)y[(long)iVar24 + -1],x,y,iVar24,0.0);
                          }
                          uVar12 = uVar17;
                          pdVar31 = local_108;
                          if (iVar11 < (int)uVar16) {
                            pbVar18 = &this->info[iVar11].taken;
                            lVar13 = (long)(int)uVar16 - (long)iVar11;
                            do {
                              *pbVar18 = true;
                              pbVar18 = pbVar18 + 0x18;
                              lVar13 = lVar13 + -1;
                            } while (lVar13 != 0);
                          }
                        }
                        uVar9 = (uint)uVar12;
                        if ((double)pdVar31 <= dVar29) goto LAB_0010d075;
                      }
                      iVar11 = (int)uVar12;
                      if (local_f0._0_1_ != '\0') goto LAB_0010d447;
                      local_108 = (double *)CONCAT44(local_108._4_4_,uVar16 - 1);
                      local_130 = (double *)CONCAT44(local_130._4_4_,uVar16 + 1);
                      do {
                        uVar9 = (uint)uVar17;
                        iVar11 = (int)uVar12;
                        if ((int)(uVar16 - 2) < iVar11) break;
                        uVar22 = iVar11 + 2;
                        Error = 10000000000.0;
                        iVar24 = 0;
                        bVar26 = (int)uVar9 < (int)uVar22;
                        if ((int)uVar22 <= (int)uVar9) {
                          uVar12 = (ulong)iVar11;
                          lVar13 = uVar12 * 0x48 + 0x40;
                          do {
                            iVar24 = 0;
                            if ((long)uVar12 <= (long)(int)uVar22) {
                              lVar15 = 0;
                              iVar24 = 0;
                              do {
                                iVar24 = iVar24 + *(int *)((long)&((lines->
                                                  super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->a +
                                                  lVar15 + lVar13);
                                lVar15 = lVar15 + 0x48;
                              } while ((int)lVar15 != 0xd8);
                            }
                            CircleFit(x,y,iVar24,&sTheta,&eTheta,&eTheta_1,&Error);
                            uVar17 = local_120;
                            if (Error <= 1.0) goto LAB_0010db10;
                            iVar11 = (lines->
                                     super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                                     _M_impl.super__Vector_impl_data._M_start[uVar12].len;
                            x = x + iVar11;
                            y = y + iVar11;
                            uVar12 = uVar12 + 1;
                            lVar13 = lVar13 + 0x48;
                            bVar27 = uVar22 != (uint)local_120;
                            bVar26 = (int)(uint)local_120 <= (int)uVar22;
                            uVar22 = uVar22 + 1;
                          } while (bVar27);
                          uVar12 = (ulong)local_108 & 0xffffffff;
                          uVar22 = (uint)local_130;
                        }
LAB_0010db10:
                        if (!bVar26) {
                          lVar13 = (long)(int)(uVar22 - 2) + -1;
                          pbVar18 = &this->info[(int)(uVar22 - 2)].taken;
                          do {
                            *pbVar18 = true;
                            lVar13 = lVar13 + 1;
                            pbVar18 = pbVar18 + 0x18;
                          } while (lVar13 < (int)uVar22);
                          while (uVar22 = uVar22 + 1, (int)uVar22 <= (int)uVar17) {
                            iVar11 = (lines->
                                     super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                                     _M_impl.super__Vector_impl_data._M_start[(int)uVar22].len +
                                     iVar24;
                            CircleFit(x,y,iVar11,&xc_1,&yc_1,&r,&error);
                            uVar17 = local_120;
                            if (1.5 < error) break;
                            sTheta = xc_1;
                            eTheta = yc_1;
                            eTheta_1 = r;
                            Error = error;
                            this->info[(int)uVar22].taken = true;
                            iVar24 = iVar11;
                          }
                          dVar29 = sTheta;
                          dVar28 = eTheta_1;
                          if (((double)iVar24 / (radius * 6.283185307179586) < 0.67) ||
                             (1.5 < circleFitError)) {
                            local_f0 = eTheta;
                            ComputeStartAndEndAngles(sTheta,eTheta,eTheta_1,x,y,iVar24,&xc_1,&yc_1);
                            in_XMM3_Qb = 0;
                            local_150 = (int)uVar12;
                            addArc(this->edarcs1->arcs,&this->edarcs1->noArcs,dVar29,local_f0,dVar28
                                   ,Error,xc_1,yc_1,this->info[local_150].sign,iVar7,(int)*x,(int)*y
                                   ,(int)x[(long)iVar24 + -1],(int)y[(long)iVar24 + -1],x,y,iVar24,
                                   (double)in_XMM6_Qa);
                          }
                          else {
                            pCVar5 = this->circles1;
                            in_XMM3_Qb = 0;
                            iVar11 = this->noCircles1;
                            pCVar5[iVar11].xc = sTheta;
                            pCVar5[iVar11].yc = eTheta;
                            pCVar5[iVar11].r = eTheta_1;
                            pCVar5[iVar11].circleFitError = Error;
                            pCVar5[iVar11].coverRatio =
                                 (double)iVar24 / (eTheta_1 * 6.283185307179586);
                            pCVar5[iVar11].x = x;
                            pCVar5[iVar11].y = y;
                            pCVar5[iVar11].noPixels = iVar24;
                            iVar11 = this->noCircles1;
                            pCVar5[iVar11].isEllipse = false;
                            this->noCircles1 = iVar11 + 1;
                          }
                          x = x + iVar24;
                          y = y + iVar24;
                          uVar12 = (ulong)uVar22;
                          bVar26 = false;
                        }
                        uVar9 = (uint)uVar17;
                      } while (!bVar26);
                    }
                  }
                  else {
LAB_0010d447:
                    this->info[iVar11].taken = true;
                    uVar9 = uVar16;
                  }
                }
              }
LAB_0010d075:
              uVar22 = uVar9;
            } while ((int)uVar9 < (int)(uint)local_128);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->super_EDPF).super_ED.segmentNos);
    }
    local_134 = local_134 + 1;
    auVar30 = local_b8;
    if (local_134 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void EDCircles::DetectArcs(vector<LineSegment> lines)
{

	double maxLineLengthThreshold = MAX(width, height) / 5;

	double MIN_ANGLE = PI / 30;  // 6 degrees
	double MAX_ANGLE = PI / 3;   // 60 degrees

	for (int iter = 1; iter <= 2; iter++) {
		if (iter == 2) MAX_ANGLE = PI / 1.9;  // 95 degrees
											  //    if (iter == 2) MAX_ANGLE = PI/2.25;  // 80 degrees

		for (int curSegmentNo = 0; curSegmentNo<segmentNos; curSegmentNo++) {
			int firstLine = segmentStartLines[curSegmentNo];
			int stopLine = segmentStartLines[curSegmentNo + 1];

			// We need at least 2 line segments
			if (stopLine - firstLine <= 1) continue;

			// Process the info for the lines of this segment
			while (firstLine < stopLine - 1) {
				// If the line is already taken during the previous step, continue
				if (info[firstLine].taken) { firstLine++; continue; }

				// very long lines cannot be part of an arc
				if (lines[firstLine].len >= maxLineLengthThreshold) { firstLine++; continue; }

				// Skip lines that cannot be part of an arc
				if (info[firstLine].angle < MIN_ANGLE || info[firstLine].angle > MAX_ANGLE) { firstLine++; continue; }

				// Find a group of lines (at least 3) with the same sign & angle < MAX_ANGLE degrees
				int lastLine = firstLine + 1;
				while (lastLine < stopLine - 1) {
					if (info[lastLine].taken) break;
					if (info[lastLine].sign != info[firstLine].sign) break;

					if (lines[lastLine].len >= maxLineLengthThreshold) break; // very long lines cannot be part of an arc
					if (info[lastLine].angle < MIN_ANGLE) break;
					if (info[lastLine].angle > MAX_ANGLE) break;

					lastLine++;
				} //end-while

				bool specialCase = false;
				int wrapCase = -1;  // 1: wrap the first two lines with the last line, 2: wrap the last two lines with the first line
#if 0
									// If we do not have 3 lines, then continue
				if (lastLine - firstLine <= 1) { firstLine = lastLine; continue; }
#else
									//        if (lastLine-firstLine == 0){firstLine=lastLine; continue;}
				if (lastLine - firstLine == 1) {
					// Just 2 lines. If long enough, then try to combine. Angle between 15 & 45 degrees. Min. length = 40
					int totalLineLength = lines[firstLine].len + lines[firstLine + 1].len;
					int shorterLen = lines[firstLine].len;
					int longerLen = lines[firstLine + 1].len;

					if (lines[firstLine + 1].len < shorterLen) {
						shorterLen = lines[firstLine + 1].len;
						longerLen = lines[firstLine].len;
					} //end-if

					if (info[firstLine].angle >= PI / 12 && info[firstLine].angle <= PI / 4 && totalLineLength >= 40 && shorterLen * 2 >= longerLen) {
						specialCase = true;
					} //end-if

					  // If the two lines do not make up for arc generation, then try to wrap the lines to the first OR last line.
					  // There are two wrapper cases: 
					if (specialCase == false) {
						// Case 1: Combine the first two lines with the last line of the segment
						if (firstLine == segmentStartLines[curSegmentNo] && info[stopLine - 1].angle >= MIN_ANGLE && info[stopLine - 1].angle <= MAX_ANGLE) {
							wrapCase = 1;
							specialCase = true;
						} //end-if            

						  // Case 2: Combine the last two lines with the first line of the segment
						else if (lastLine == stopLine - 1 && info[lastLine].angle >= MIN_ANGLE && info[lastLine].angle <= MAX_ANGLE) {
							wrapCase = 2;
							specialCase = true;
						} //end-if            
					} // end-if

					  // If still not enough for arc generation, then skip
					if (specialCase == false) {
						firstLine = lastLine;
						continue;
					} //end-else
				} //end-if
#endif

				  // Copy the pixels of this segment to an array
				int noPixels = 0;
				double *x = bm->getX();
				double *y = bm->getY();

				// wrapCase 1: Combine the first two lines with the last line of the segment
				if (wrapCase == 1) {
					int index = lines[stopLine - 1].firstPixelIndex;

					for (int n = 0; n<lines[stopLine - 1].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-if

				for (int m = firstLine; m <= lastLine; m++) {
					int index = lines[m].firstPixelIndex;

					for (int n = 0; n<lines[m].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-for

				  // wrapCase 2: Combine the last two lines with the first line of the segment
				if (wrapCase == 2) {
					int index = lines[segmentStartLines[curSegmentNo]].firstPixelIndex;

					for (int n = 0; n<lines[segmentStartLines[curSegmentNo]].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-if

				  // Move buffer pointers
				bm->move(noPixels);

				// Try to fit a circle to the entire arc of lines
				double xc, yc, radius, circleFitError;
				CircleFit(x, y, noPixels, &xc, &yc, &radius, &circleFitError);

				double coverage = noPixels / (TWOPI*radius);

				// In the case of the special case, the arc must cover at least 22.5 degrees
				if (specialCase && coverage < 1.0 / 16) { info[firstLine].taken = true; firstLine = lastLine; continue; }

				// If only 3 lines, use the SHORT_ARC_ERROR
				double MYERROR = SHORT_ARC_ERROR;
				if (lastLine - firstLine >= 3) MYERROR = LONG_ARC_ERROR;
				if (circleFitError <= MYERROR) {
					// Add this to the list of arcs
					if (wrapCase == 1) {
						x += lines[stopLine - 1].len;
						y += lines[stopLine - 1].len;
						noPixels -= lines[stopLine - 1].len;

					}
					else if (wrapCase == 2) {
						noPixels -= lines[segmentStartLines[curSegmentNo]].len;
					} //end-else

					if ((coverage >= FULL_CIRCLE_RATIO && circleFitError <= LONG_ARC_ERROR)) {
						addCircle(circles1, noCircles1, xc, yc, radius, circleFitError, x, y, noPixels);

					}
					else {
						double sTheta, eTheta;
						ComputeStartAndEndAngles(xc, yc, radius, x, y, noPixels, &sTheta, &eTheta);

						addArc(edarcs1->arcs, edarcs1->noArcs, xc, yc, radius, circleFitError, sTheta, eTheta, info[firstLine].sign, curSegmentNo,
							(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
					} //end-else

					for (int m = firstLine; m<lastLine; m++) info[m].taken = true;
					firstLine = lastLine;
					continue;
				} //end-if

				  // Check if this is an almost closed loop (i.e, if 60% of the circle is present). If so, try to fit an ellipse to the entire arc of lines
				double dx = x[0] - x[noPixels - 1];
				double dy = y[0] - y[noPixels - 1];
				double distanceBetweenEndPoints = sqrt(dx*dx + dy*dy);

				bool isAlmostClosedLoop = (distanceBetweenEndPoints <= 1.72*radius && coverage >= FULL_CIRCLE_RATIO);
				if (isAlmostClosedLoop || (iter == 1 && coverage >= 0.25)) {  // an arc covering at least 90 degrees
					EllipseEquation eq;
					double ellipseFitError = 1e10;

					bool valid = EllipseFit(x, y, noPixels, &eq);
					if (valid) ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);

					MYERROR = ELLIPSE_ERROR;
					if (isAlmostClosedLoop == false) MYERROR = 0.75;

					if (ellipseFitError <= MYERROR) {
						// Add this to the list of arcs
						if (wrapCase == 1) {
							x += lines[stopLine - 1].len;
							y += lines[stopLine - 1].len;
							noPixels -= lines[stopLine - 1].len;

						}
						else if (wrapCase == 2) {
							noPixels -= lines[segmentStartLines[curSegmentNo]].len;
						} //end-else

						if (isAlmostClosedLoop) {
							addCircle(circles1, noCircles1, xc, yc, radius, circleFitError, &eq, ellipseFitError, x, y, noPixels);  // Add an ellipse for validation

						}
						else {
							double sTheta, eTheta;
							ComputeStartAndEndAngles(xc, yc, radius, x, y, noPixels, &sTheta, &eTheta);

							addArc(edarcs1->arcs, edarcs1->noArcs,  xc, yc, radius, circleFitError, sTheta, eTheta, info[firstLine].sign, curSegmentNo, &eq, ellipseFitError,
								(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
						} //end-else

						for (int m = firstLine; m<lastLine; m++) info[m].taken = true;
						firstLine = lastLine;
						continue;
					} //end-if
				} //end-if

				if (specialCase) { info[firstLine].taken = true; firstLine = lastLine; continue; }

				// Continue until we finish all lines that belong to arc of lines
				while (firstLine <= lastLine - 2) {
					// Fit an initial arc and extend it
					int curLine = firstLine + 2;

					// Fit a circle to the pixels of these lines and see if the error is less than a threshold
					double XC, YC, R, Error = 1e10;
					bool found = false;

					noPixels = 0;
					while (curLine <= lastLine) {
						noPixels = 0;
						for (int m = firstLine; m <= curLine; m++) noPixels += lines[m].len;

						// Fit circle
						CircleFit(x, y, noPixels, &XC, &YC, &R, &Error);
						if (Error <= SHORT_ARC_ERROR) { found = true; break; } // found if the error is smaller than the threshold

																			   // Not found. Move to the next set of lines
						x += lines[firstLine].len;
						y += lines[firstLine].len;

						firstLine++;
						curLine++;
					} //end-while

					  // If no initial arc found, then we are done with this arc of lines
					if (!found) break;

					// If we found an initial arc, then extend it
					for (int m = curLine - 2; m <= curLine; m++) info[m].taken = true;
					curLine++;
					while (curLine <= lastLine) {
						int index = lines[curLine].firstPixelIndex;
						int noPixelsSave = noPixels;

						noPixels += lines[curLine].len;

						double xc, yc, r, error;
						CircleFit(x, y, noPixels, &xc, &yc, &r, &error);
						if (error > LONG_ARC_ERROR) { noPixels = noPixelsSave; break; }   // Adding this line made the error big. So, we do not use this line

																						  // OK. Longer arc
						XC = xc;
						YC = yc;
						R = r;
						Error = error;

						info[curLine].taken = true;
						curLine++;
					} //end-while

					double coverage = noPixels / (TWOPI*radius);
					if ((coverage >= FULL_CIRCLE_RATIO && circleFitError <= LONG_ARC_ERROR)) {
						addCircle(circles1, noCircles1, XC, YC, R, Error, x, y, noPixels);

					}
					else {
						// Add this to the list of arcs
						double sTheta, eTheta;
						ComputeStartAndEndAngles(XC, YC, R, x, y, noPixels, &sTheta, &eTheta);

						addArc(edarcs1->arcs, edarcs1->noArcs, XC, YC, R, Error, sTheta, eTheta, info[firstLine].sign, curSegmentNo,
							(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
					} //end-else

					x += noPixels;
					y += noPixels;

					firstLine = curLine;
				} //end-while-current-arc-of-lines

				firstLine = lastLine;
			} //end-while-entire-edge-segment
		} //end-for
	} //end-for-iter
}